

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  Slice *contents;
  long *in_RDI;
  long in_FS_OFFSET;
  BlockContents *in_stack_00000020;
  BlockHandle *in_stack_00000028;
  ReadOptions *in_stack_00000030;
  RandomAccessFile *in_stack_00000038;
  ReadOptions opt;
  BlockHandle filter_handle;
  Slice v;
  BlockContents block;
  BlockContents *in_stack_ffffffffffffff28;
  Slice *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  FilterBlockReader *this_00;
  byte local_f;
  size_t local_8;
  
  local_8 = *(size_t *)(in_FS_OFFSET + 0x28);
  BlockHandle::BlockHandle((BlockHandle *)in_stack_ffffffffffffff28);
  BlockHandle::DecodeFrom
            ((BlockHandle *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  bVar1 = Status::ok((Status *)in_stack_ffffffffffffff28);
  Status::~Status((Status *)in_stack_ffffffffffffff28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ReadOptions::ReadOptions((ReadOptions *)in_stack_ffffffffffffff28);
    this_00 = (FilterBlockReader *)&stack0xffffffffffffffe0;
    BlockContents::BlockContents(in_stack_ffffffffffffff28);
    ReadBlock(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
    bVar1 = Status::ok((Status *)in_stack_ffffffffffffff28);
    bVar2 = bVar1 ^ 0xff;
    Status::~Status((Status *)in_stack_ffffffffffffff28);
    if ((bVar2 & 1) == 0) {
      if ((local_f & 1) != 0) {
        pcVar3 = Slice::data(&in_stack_ffffffffffffff28->data);
        *(char **)(*in_RDI + 0x80) = pcVar3;
      }
      contents = (Slice *)operator_new(0x28);
      FilterBlockReader::FilterBlockReader
                (this_00,(FilterPolicy *)CONCAT17(bVar2,in_stack_ffffffffffffff40),contents);
      *(Slice **)(*in_RDI + 0x78) = contents;
    }
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}